

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lundump.c
# Opt level: O3

void LoadFunction(LoadState *S,Proto *f,TString *psource)

{
  bool bVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  TString *pTVar4;
  Instruction *b;
  TValue *pTVar5;
  Upvaldesc *pUVar6;
  Proto **ppPVar7;
  Proto *pPVar8;
  int *b_00;
  LocVar *pLVar9;
  long lVar10;
  long lVar11;
  size_t sVar12;
  int iVar16;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  long lVar18;
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  int iVar22;
  undefined1 auVar21 [16];
  int x;
  uint local_40;
  undefined4 uStack_3c;
  size_t local_38;
  
  pTVar4 = LoadString(S);
  if (pTVar4 != (TString *)0x0) {
    psource = pTVar4;
  }
  f->source = psource;
  LoadBlock(S,&local_40,4);
  f->linedefined = local_40;
  LoadBlock(S,&local_40,4);
  f->lastlinedefined = local_40;
  LoadBlock(S,&local_40,1);
  f->numparams = (lu_byte)local_40;
  LoadBlock(S,&local_40,1);
  f->is_vararg = (lu_byte)local_40;
  LoadBlock(S,&local_40,1);
  f->maxstacksize = (lu_byte)local_40;
  LoadBlock(S,&local_40,4);
  uVar3 = local_40;
  lVar10 = (long)(int)local_40;
  b = (Instruction *)luaM_realloc_(S->L,(void *)0x0,0,lVar10 << 2);
  f->code = b;
  f->sizecode = uVar3;
  LoadBlock(S,b,lVar10 << 2);
  LoadBlock(S,&local_40,4);
  uVar3 = local_40;
  lVar10 = (long)(int)local_40;
  local_38 = lVar10 << 4;
  pTVar5 = (TValue *)luaM_realloc_(S->L,(void *)0x0,0,local_38);
  f->k = pTVar5;
  f->sizek = uVar3;
  auVar2 = _DAT_00124330;
  if (0 < lVar10) {
    lVar10 = lVar10 + -1;
    auVar13._8_4_ = (int)lVar10;
    auVar13._0_8_ = lVar10;
    auVar13._12_4_ = (int)((ulong)lVar10 >> 0x20);
    lVar10 = 0;
    auVar13 = auVar13 ^ _DAT_00124330;
    auVar20 = _DAT_00124310;
    auVar19 = _DAT_00124320;
    do {
      auVar21 = auVar19 ^ auVar2;
      iVar16 = auVar13._4_4_;
      if ((bool)(~(auVar21._4_4_ == iVar16 && auVar13._0_4_ < auVar21._0_4_ ||
                  iVar16 < auVar21._4_4_) & 1)) {
        *(undefined4 *)((long)&pTVar5->tt_ + lVar10) = 0;
      }
      if ((auVar21._12_4_ != auVar13._12_4_ || auVar21._8_4_ <= auVar13._8_4_) &&
          auVar21._12_4_ <= auVar13._12_4_) {
        *(undefined4 *)((long)&pTVar5[1].tt_ + lVar10) = 0;
      }
      auVar21 = auVar20 ^ auVar2;
      iVar22 = auVar21._4_4_;
      if (iVar22 <= iVar16 && (iVar22 != iVar16 || auVar21._0_4_ <= auVar13._0_4_)) {
        *(undefined4 *)((long)&pTVar5[2].tt_ + lVar10) = 0;
        *(undefined4 *)((long)&pTVar5[3].tt_ + lVar10) = 0;
      }
      lVar11 = auVar19._8_8_;
      auVar19._0_8_ = auVar19._0_8_ + 4;
      auVar19._8_8_ = lVar11 + 4;
      lVar11 = auVar20._8_8_;
      auVar20._0_8_ = auVar20._0_8_ + 4;
      auVar20._8_8_ = lVar11 + 4;
      lVar10 = lVar10 + 0x40;
    } while ((ulong)(uVar3 + 3 >> 2) << 6 != lVar10);
    sVar12 = 0;
    do {
      pTVar5 = f->k;
      LoadBlock(S,&local_40,1);
      uVar3 = local_40 & 0xff;
      switch((lu_byte)local_40) {
      case '\0':
        break;
      case '\x01':
        LoadBlock(S,&local_40,1);
        *(uint *)((long)&pTVar5->value_ + sVar12) = local_40 & 0xff;
        uVar3 = 1;
        break;
      case '\x02':
        goto switchD_0011ad17_caseD_2;
      case '\x03':
        LoadBlock(S,&local_40,8);
        *(ulong *)((long)&pTVar5->value_ + sVar12) = CONCAT44(uStack_3c,local_40);
        uVar3 = 3;
        break;
      case '\x04':
switchD_0011ad17_caseD_4:
        pTVar4 = LoadString(S);
        *(TString **)((long)&pTVar5->value_ + sVar12) = pTVar4;
        uVar3 = pTVar4->tt | 0x40;
        break;
      default:
        if ((local_40 & 0xff) == 0x13) {
          LoadBlock(S,&local_40,8);
          *(ulong *)((long)&pTVar5->value_ + sVar12) = CONCAT44(uStack_3c,local_40);
          uVar3 = 0x13;
          break;
        }
        if ((local_40 & 0xff) == 0x14) goto switchD_0011ad17_caseD_4;
        goto switchD_0011ad17_caseD_2;
      }
      *(uint *)((long)&pTVar5->tt_ + sVar12) = uVar3;
switchD_0011ad17_caseD_2:
      sVar12 = sVar12 + 0x10;
    } while (local_38 != sVar12);
  }
  LoadBlock(S,&local_40,4);
  uVar3 = local_40;
  lVar10 = (long)(int)local_40;
  pUVar6 = (Upvaldesc *)luaM_realloc_(S->L,(void *)0x0,0,lVar10 << 4);
  f->upvalues = pUVar6;
  f->sizeupvalues = uVar3;
  auVar2 = _DAT_00124330;
  if (0 < lVar10) {
    lVar11 = lVar10 + -1;
    auVar14._8_4_ = (int)lVar11;
    auVar14._0_8_ = lVar11;
    auVar14._12_4_ = (int)((ulong)lVar11 >> 0x20);
    lVar11 = 0;
    auVar14 = auVar14 ^ _DAT_00124330;
    auVar21 = _DAT_00124320;
    do {
      bVar1 = auVar14._0_4_ < SUB164(auVar21 ^ auVar2,0);
      iVar16 = auVar14._4_4_;
      iVar22 = SUB164(auVar21 ^ auVar2,4);
      if ((bool)(~(iVar16 < iVar22 || iVar22 == iVar16 && bVar1) & 1)) {
        *(undefined8 *)((long)&pUVar6->name + lVar11) = 0;
      }
      if (iVar16 >= iVar22 && (iVar22 != iVar16 || !bVar1)) {
        *(undefined8 *)((long)&pUVar6[1].name + lVar11) = 0;
      }
      lVar18 = auVar21._8_8_;
      auVar21._0_8_ = auVar21._0_8_ + 2;
      auVar21._8_8_ = lVar18 + 2;
      lVar11 = lVar11 + 0x20;
    } while ((ulong)(uVar3 + 1 >> 1) << 5 != lVar11);
    sVar12 = 0;
    do {
      LoadBlock(S,&local_40,1);
      (&f->upvalues->instack)[sVar12] = (lu_byte)local_40;
      LoadBlock(S,&local_40,1);
      (&f->upvalues->idx)[sVar12] = (lu_byte)local_40;
      sVar12 = sVar12 + 0x10;
    } while (lVar10 << 4 != sVar12);
  }
  LoadBlock(S,&local_40,4);
  uVar3 = local_40;
  lVar10 = (long)(int)local_40;
  ppPVar7 = (Proto **)luaM_realloc_(S->L,(void *)0x0,0,lVar10 * 8);
  f->p = ppPVar7;
  f->sizep = uVar3;
  if (0 < lVar10) {
    lVar11 = 0;
    do {
      f->p[lVar11] = (Proto *)0x0;
      lVar11 = lVar11 + 1;
    } while (lVar10 != lVar11);
    if (0 < (int)uVar3) {
      lVar11 = 0;
      do {
        pPVar8 = luaF_newproto(S->L);
        f->p[lVar11] = pPVar8;
        LoadFunction(S,f->p[lVar11],f->source);
        lVar11 = lVar11 + 1;
      } while (lVar10 != lVar11);
    }
  }
  LoadBlock(S,&local_40,4);
  uVar3 = local_40;
  lVar10 = (long)(int)local_40;
  b_00 = (int *)luaM_realloc_(S->L,(void *)0x0,0,lVar10 << 2);
  f->lineinfo = b_00;
  f->sizelineinfo = uVar3;
  LoadBlock(S,b_00,lVar10 << 2);
  LoadBlock(S,&local_40,4);
  uVar3 = local_40;
  lVar10 = (long)(int)local_40;
  pLVar9 = (LocVar *)luaM_realloc_(S->L,(void *)0x0,0,lVar10 << 4);
  f->locvars = pLVar9;
  f->sizelocvars = uVar3;
  auVar2 = _DAT_00124330;
  if (0 < lVar10) {
    lVar11 = lVar10 + -1;
    auVar15._8_4_ = (int)lVar11;
    auVar15._0_8_ = lVar11;
    auVar15._12_4_ = (int)((ulong)lVar11 >> 0x20);
    lVar11 = 0;
    auVar15 = auVar15 ^ _DAT_00124330;
    auVar17 = _DAT_00124320;
    do {
      auVar20 = auVar17 ^ auVar2;
      if ((bool)(~(auVar20._4_4_ == auVar15._4_4_ && auVar15._0_4_ < auVar20._0_4_ ||
                  auVar15._4_4_ < auVar20._4_4_) & 1)) {
        *(undefined8 *)((long)&pLVar9->varname + lVar11) = 0;
      }
      if ((auVar20._12_4_ != auVar15._12_4_ || auVar20._8_4_ <= auVar15._8_4_) &&
          auVar20._12_4_ <= auVar15._12_4_) {
        *(undefined8 *)((long)&pLVar9[1].varname + lVar11) = 0;
      }
      lVar18 = auVar17._8_8_;
      auVar17._0_8_ = auVar17._0_8_ + 2;
      auVar17._8_8_ = lVar18 + 2;
      lVar11 = lVar11 + 0x20;
    } while ((ulong)(uVar3 + 1 >> 1) << 5 != lVar11);
    sVar12 = 0;
    do {
      pTVar4 = LoadString(S);
      *(TString **)((long)&f->locvars->varname + sVar12) = pTVar4;
      LoadBlock(S,&local_40,4);
      *(uint *)((long)&f->locvars->startpc + sVar12) = local_40;
      LoadBlock(S,&local_40,4);
      *(uint *)((long)&f->locvars->endpc + sVar12) = local_40;
      sVar12 = sVar12 + 0x10;
    } while (lVar10 << 4 != sVar12);
  }
  LoadBlock(S,&local_40,4);
  if (0 < (long)(int)local_40) {
    lVar10 = 0;
    do {
      pTVar4 = LoadString(S);
      *(TString **)((long)&f->upvalues->name + lVar10) = pTVar4;
      lVar10 = lVar10 + 0x10;
    } while ((long)(int)local_40 * 0x10 != lVar10);
  }
  return;
}

Assistant:

static void LoadFunction(LoadState *S, Proto *f, TString *psource) {
    f->source = LoadString(S);
    if (f->source == NULL)  /* no source in dump? */
        f->source = psource;  /* reuse parent's source */
    f->linedefined = LoadInt(S);
    f->lastlinedefined = LoadInt(S);
    f->numparams = LoadByte(S);
    f->is_vararg = LoadByte(S);
    f->maxstacksize = LoadByte(S);
    LoadCode(S, f);
    LoadConstants(S, f);
    LoadUpvalues(S, f);
    LoadProtos(S, f);
    LoadDebug(S, f);
}